

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ec_combine(void)

{
  int iVar1;
  secp256k1_scalar s;
  int i;
  secp256k1_ge Q;
  secp256k1_gej Qj;
  secp256k1_pubkey sd2;
  secp256k1_pubkey sd;
  secp256k1_pubkey *d [6];
  secp256k1_pubkey data [6];
  secp256k1_scalar sum;
  int local_334;
  secp256k1_scalar *in_stack_fffffffffffffcd0;
  secp256k1_scalar *in_stack_fffffffffffffcd8;
  secp256k1_scalar *in_stack_fffffffffffffce0;
  secp256k1_ge *in_stack_fffffffffffffce8;
  secp256k1_pubkey *in_stack_fffffffffffffcf0;
  secp256k1_gej *in_stack_fffffffffffffcf8;
  secp256k1_ge *in_stack_fffffffffffffd00;
  secp256k1_scalar *in_stack_fffffffffffffd80;
  secp256k1_gej *in_stack_fffffffffffffd88;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffd90;
  secp256k1_context *in_stack_fffffffffffffd98;
  undefined1 local_258 [64];
  undefined1 local_218 [64];
  long local_1d8 [6];
  undefined1 local_1a8 [392];
  undefined1 local_20 [32];
  
  memset(local_20,0,0x20);
  local_334 = 1;
  while( true ) {
    if (6 < local_334) {
      return;
    }
    random_scalar_order_test(in_stack_fffffffffffffcd0);
    secp256k1_scalar_add
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    secp256k1_ecmult_gen
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    secp256k1_ge_set_gej(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    secp256k1_pubkey_save(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    local_1d8[local_334 + -1] = (long)(local_1a8 + (long)(local_334 + -1) * 0x40);
    secp256k1_ecmult_gen
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    secp256k1_ge_set_gej(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    secp256k1_pubkey_save(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    iVar1 = secp256k1_ec_pubkey_combine
                      (in_stack_fffffffffffffd98,(secp256k1_pubkey *)in_stack_fffffffffffffd90,
                       (secp256k1_pubkey **)in_stack_fffffffffffffd88,
                       (size_t)in_stack_fffffffffffffd80);
    if (iVar1 != 1) break;
    iVar1 = secp256k1_memcmp_var(local_218,local_258,0x40);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x104f,"test condition failed: secp256k1_memcmp_var(&sd, &sd2, sizeof(sd)) == 0");
      abort();
    }
    local_334 = local_334 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0x104e,"test condition failed: secp256k1_ec_pubkey_combine(CTX, &sd2, d, i) == 1");
  abort();
}

Assistant:

static void test_ec_combine(void) {
    secp256k1_scalar sum = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    secp256k1_pubkey data[6];
    const secp256k1_pubkey* d[6];
    secp256k1_pubkey sd;
    secp256k1_pubkey sd2;
    secp256k1_gej Qj;
    secp256k1_ge Q;
    int i;
    for (i = 1; i <= 6; i++) {
        secp256k1_scalar s;
        random_scalar_order_test(&s);
        secp256k1_scalar_add(&sum, &sum, &s);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &Qj, &s);
        secp256k1_ge_set_gej(&Q, &Qj);
        secp256k1_pubkey_save(&data[i - 1], &Q);
        d[i - 1] = &data[i - 1];
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &Qj, &sum);
        secp256k1_ge_set_gej(&Q, &Qj);
        secp256k1_pubkey_save(&sd, &Q);
        CHECK(secp256k1_ec_pubkey_combine(CTX, &sd2, d, i) == 1);
        CHECK(secp256k1_memcmp_var(&sd, &sd2, sizeof(sd)) == 0);
    }
}